

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O0

long scatter(int sx,int sy,int blastforce,uint scflags,obj *obj)

{
  scatter_chain *psVar1;
  boolean bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  trap *trap_00;
  scatter_chain *psVar6;
  bool bVar7;
  bool bVar8;
  monst *local_c8;
  level *local_b8;
  level *local_a8;
  int y;
  int x;
  int hitu;
  int hitvalu;
  trap *trap;
  long lStack_80;
  boolean visible;
  long total;
  scatter_chain *schain;
  scatter_chain *stmp2;
  scatter_chain *stmp;
  monst *mtmp;
  boolean individual_object;
  boolean used_up;
  long qtmp;
  int local_40;
  int iStack_3c;
  uchar typ;
  int farthest;
  int tmp;
  level *lev;
  obj *ostack;
  obj *otmp;
  obj *obj_local;
  uint scflags_local;
  int blastforce_local;
  int sy_local;
  int sx_local;
  
  if (obj == (obj *)0x0) {
    local_a8 = level;
  }
  else {
    local_a8 = obj->olev;
  }
  local_40 = 0;
  schain = (scatter_chain *)0x0;
  total = 0;
  lStack_80 = 0;
  bVar7 = false;
  psVar1 = (scatter_chain *)total;
  psVar6 = schain;
  otmp = obj;
  if (local_a8 == level) {
    bVar7 = (viz_array[sy][sx] & 2U) != 0;
  }
  while( true ) {
    schain = psVar6;
    total = (long)psVar1;
    if (obj == (obj *)0x0) {
      local_b8 = (level *)local_a8->objects[sx][sy];
    }
    else {
      local_b8 = (level *)otmp;
    }
    ostack = (obj *)local_b8;
    if (local_b8 == (level *)0x0) break;
    if (*(int *)((long)local_b8->levname + 0x30) < 2) {
      lev = (level *)0x0;
      otmp = (obj *)0x0;
    }
    else {
      iVar3 = *(int *)((long)local_b8->levname + 0x30) + -1;
      if (0x7fff < iVar3) {
        iVar3 = 0x7fff;
      }
      iVar3 = rnd(iVar3);
      lev = local_b8;
      ostack = splitobj((obj *)local_b8,(long)iVar3);
    }
    obj_extract_self(ostack);
    bVar8 = false;
    if ((((scflags & 0x10) == 0) || ((ostack->otyp != 0x214 && (ostack->otyp != 0x215)))) ||
       (iVar3 = rn2(10), iVar3 == 0)) {
      if (((scflags & 8) != 0) &&
         (((iVar3 = rn2(10), iVar3 == 0 ||
           ((*(ushort *)&objects[ostack->otyp].field_0x11 >> 4 & 0x1f) == 0x13)) ||
          (ostack->otyp == 0x10f)))) {
        iVar3 = breaks(ostack,(xchar)sx,(xchar)sy);
        bVar8 = iVar3 != 0;
      }
    }
    else {
      if (ostack->otyp == 0x214) {
        if (bVar7) {
          pcVar5 = Tobjnam(ostack,"break");
          pline("%s apart.",pcVar5);
        }
        fracture_rock(ostack);
        place_object(ostack,local_a8,sx,sy);
        ostack = sobj_at(0x214,local_a8,sx,sy);
        if (ostack != (obj *)0x0) {
          obj_extract_self(ostack);
          place_object(ostack,local_a8,sx,sy);
        }
      }
      else {
        trap_00 = t_at(local_a8,sx,sy);
        if ((trap_00 != (trap *)0x0) && ((trap_00->field_0x8 & 0x1f) == 0x14)) {
          deltrap(local_a8,trap_00);
        }
        if (bVar7) {
          pcVar5 = Tobjnam(ostack,"crumble");
          pline("%s.",pcVar5);
        }
        break_statue(ostack);
        place_object(ostack,local_a8,sx,sy);
      }
      bVar8 = true;
    }
    psVar1 = (scatter_chain *)total;
    psVar6 = schain;
    if (!bVar8) {
      psVar6 = (scatter_chain *)malloc(0x28);
      psVar6->next = (scatter_chain *)0x0;
      psVar6->obj = ostack;
      psVar6->ostack = (obj *)lev;
      psVar6->ox = (xchar)sx;
      psVar6->oy = (xchar)sy;
      iVar3 = rn2(8);
      psVar6->dx = xdir[iVar3];
      psVar6->dy = ""[iVar3];
      iStack_3c = blastforce - ostack->owt / 0x28;
      if (iStack_3c < 1) {
        iStack_3c = 1;
      }
      iVar3 = rnd(iStack_3c);
      psVar6->range = iVar3;
      if (local_40 < psVar6->range) {
        local_40 = psVar6->range;
      }
      psVar6->stopped = '\0';
      psVar1 = psVar6;
      if (total != 0) {
        schain->next = psVar6;
        psVar1 = (scatter_chain *)total;
      }
    }
  }
  while (iVar3 = local_40 + -1, 0 < local_40) {
    for (stmp2 = (scatter_chain *)total; local_40 = iVar3, stmp2 != (scatter_chain *)0x0;
        stmp2 = stmp2->next) {
      iVar4 = stmp2->range;
      stmp2->range = iVar4 + -1;
      if ((0 < iVar4) && (stmp2->stopped == '\0')) {
        bhitpos.x = stmp2->ox + stmp2->dx;
        bhitpos.y = stmp2->oy + stmp2->dy;
        if ((bhitpos.x < '\x01') ||
           ((('O' < bhitpos.x || (bhitpos.y < '\0')) || ('\x14' < bhitpos.y)))) {
          bhitpos.x = bhitpos.x - stmp2->dx;
          bhitpos.y = bhitpos.y - stmp2->dy;
          stmp2->stopped = '\x01';
        }
        else if (((byte)local_a8->locations[bhitpos.x][bhitpos.y].typ < 0x11) ||
                (bVar2 = closed_door(local_a8,(int)bhitpos.x,(int)bhitpos.y), bVar2 != '\0')) {
          bhitpos.x = bhitpos.x - stmp2->dx;
          bhitpos.y = bhitpos.y - stmp2->dy;
          stmp2->stopped = '\x01';
        }
        else {
          if ((local_a8->monsters[bhitpos.x][bhitpos.y] == (monst *)0x0) ||
             ((*(uint *)&local_a8->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) != 0)) {
            local_c8 = (monst *)0x0;
          }
          else {
            local_c8 = local_a8->monsters[bhitpos.x][bhitpos.y];
          }
          if (local_c8 == (monst *)0x0) {
            if (((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) && ((scflags & 4) != 0)) {
              if (multi != 0) {
                nomul(0,(char *)0x0);
              }
              iVar4 = (int)stmp2->obj->spe;
              x = iVar4 + 8;
              if (2 < (youmonst.data)->msize) {
                x = iVar4 + 9;
              }
              iVar4 = dmgval((monst *)0x0,stmp2->obj,'\x01',&youmonst);
              iVar4 = thitu(x,iVar4,stmp2->obj,stmp2->ostack,(monst *)0x0,(char *)0x0);
              if (iVar4 != 0) {
                stmp2->range = stmp2->range + -3;
                stop_occupation();
              }
            }
          }
          else if ((scflags & 2) != 0) {
            stmp2->range = stmp2->range + -1;
            iVar4 = ohitmon((monst *)0x0,local_c8,stmp2->obj,stmp2->ostack,1,'\0');
            if (iVar4 != 0) {
              stmp2->obj = (obj *)0x0;
              stmp2->stopped = '\x01';
            }
          }
        }
        stmp2->ox = bhitpos.x;
        stmp2->oy = bhitpos.y;
      }
    }
  }
  stmp2 = (scatter_chain *)total;
  while (stmp2 != (scatter_chain *)0x0) {
    psVar1 = stmp2->next;
    iVar3 = (int)stmp2->ox;
    iVar4 = (int)stmp2->oy;
    if (stmp2->obj != (obj *)0x0) {
      if ((iVar3 != sx) || (iVar4 != sy)) {
        lStack_80 = stmp2->obj->quan + lStack_80;
      }
      place_object(stmp2->obj,local_a8,iVar3,iVar4);
      stackobj(stmp2->obj);
    }
    free(stmp2);
    newsym(iVar3,iVar4);
    stmp2 = psVar1;
  }
  newsym(sx,sy);
  return lStack_80;
}

Assistant:

long scatter(int sx, int sy,	/* location of objects to scatter */
             int blastforce,	/* force behind the scattering	*/
             unsigned int scflags,
             struct obj *obj)	/* only scatter this obj        */
{
	struct obj *otmp;
	struct obj *ostack;
	struct level *lev = obj ? obj->olev : level;
	int tmp;
	int farthest = 0;
	uchar typ;
	long qtmp;
	boolean used_up;
	boolean individual_object = obj ? TRUE : FALSE;
	struct monst *mtmp;
	struct scatter_chain *stmp, *stmp2 = 0;
	struct scatter_chain *schain = NULL;
	long total = 0L;
	boolean visible = (lev == level && cansee(sx, sy));

	while ((otmp = individual_object ? obj : lev->objects[sx][sy]) != 0) {
	    if (otmp->quan > 1L) {
		qtmp = otmp->quan - 1;
		if (qtmp > LARGEST_INT) qtmp = LARGEST_INT;
		qtmp = (long)rnd((int)qtmp);
		ostack = otmp;
		otmp = splitobj(otmp, qtmp);
	    } else {
		ostack = NULL;
		obj = NULL; /* all used */
	    }
	    obj_extract_self(otmp);
	    used_up = FALSE;

	    /* 9 in 10 chance of fracturing boulders or statues */
	    if ((scflags & MAY_FRACTURE)
			&& ((otmp->otyp == BOULDER) || (otmp->otyp == STATUE))
			&& rn2(10)) {
		if (otmp->otyp == BOULDER) {
		    if (visible)
			pline("%s apart.", Tobjnam(otmp, "break"));
		    fracture_rock(otmp);
		    place_object(otmp, lev, sx, sy);
		    if ((otmp = sobj_at(BOULDER, lev, sx, sy)) != 0) {
			/* another boulder here, restack it to the top */
			obj_extract_self(otmp);
			place_object(otmp, lev, sx, sy);
		    }
		} else {
		    struct trap *trap;

		    if ((trap = t_at(lev, sx, sy)) && trap->ttyp == STATUE_TRAP)
			    deltrap(lev, trap);
		    if (visible)
			pline("%s.", Tobjnam(otmp, "crumble"));
		    break_statue(otmp);
		    place_object(otmp, lev, sx, sy);	/* put fragments on floor */
		}
		used_up = TRUE;

	    /* 1 in 10 chance of destruction of obj; glass, egg destruction */
	    } else if ((scflags & MAY_DESTROY) && (!rn2(10)
			|| (objects[otmp->otyp].oc_material == GLASS
			|| otmp->otyp == EGG))) {
		if (breaks(otmp, (xchar)sx, (xchar)sy)) used_up = TRUE;
	    }

	    if (!used_up) {
		stmp = malloc(sizeof(struct scatter_chain));
		stmp->next = NULL;
		stmp->obj = otmp;
		stmp->ostack = ostack;
		stmp->ox = sx;
		stmp->oy = sy;
		tmp = rn2(8);		/* get the direction */
		stmp->dx = xdir[tmp];
		stmp->dy = ydir[tmp];
		tmp = blastforce - (otmp->owt/40);
		if (tmp < 1) tmp = 1;
		stmp->range = rnd(tmp); /* anywhere up to that determ. by wt */
		if (farthest < stmp->range) farthest = stmp->range;
		stmp->stopped = FALSE;
		if (!schain)
		    schain = stmp;
		else
		    stmp2->next = stmp;
		stmp2 = stmp;
	    }
	}

	while (farthest-- > 0) {
		for (stmp = schain; stmp; stmp = stmp->next) {
		   if ((stmp->range-- > 0) && (!stmp->stopped)) {
			bhitpos.x = stmp->ox + stmp->dx;
			bhitpos.y = stmp->oy + stmp->dy;
			typ = lev->locations[bhitpos.x][bhitpos.y].typ;
			if (!isok(bhitpos.x, bhitpos.y)) {
				bhitpos.x -= stmp->dx;
				bhitpos.y -= stmp->dy;
				stmp->stopped = TRUE;
			} else if (!ZAP_POS(typ) ||
					closed_door(lev, bhitpos.x, bhitpos.y)) {
				bhitpos.x -= stmp->dx;
				bhitpos.y -= stmp->dy;
				stmp->stopped = TRUE;
			} else if ((mtmp = m_at(lev, bhitpos.x, bhitpos.y)) != 0) {
				if (scflags & MAY_HITMON) {
				    stmp->range--;
				    if (ohitmon(NULL, mtmp, stmp->obj,
						stmp->ostack, 1, FALSE)) {
					stmp->obj = NULL;
					stmp->stopped = TRUE;
				    }
				}
			} else if (bhitpos.x==u.ux && bhitpos.y==u.uy) {
				if (scflags & MAY_HITYOU) {
				    int hitvalu, hitu;

				    if (multi) nomul(0, NULL);
				    hitvalu = 8 + stmp->obj->spe;
				    if (bigmonst(youmonst.data)) hitvalu++;
				    hitu = thitu(hitvalu,
						 dmgval(NULL, stmp->obj, TRUE,
							&youmonst),
						 stmp->obj, stmp->ostack, NULL,
						 NULL);
				    if (hitu) {
					stmp->range -= 3;
					stop_occupation();
				    }
				}
			} else {
				if (scflags & VIS_EFFECTS) {
				    /* tmp_at(bhitpos.x, bhitpos.y); */
				    /* delay_output(); */
				}
			}
			stmp->ox = bhitpos.x;
			stmp->oy = bhitpos.y;
		   }
		}
	}
	for (stmp = schain; stmp; stmp = stmp2) {
		int x,y;

		stmp2 = stmp->next;
		x = stmp->ox; y = stmp->oy;
		if (stmp->obj) {
			if ( x!=sx || y!=sy )
			    total += stmp->obj->quan;
			place_object(stmp->obj, lev, x, y);
			stackobj(stmp->obj);
		}
		free(stmp);
		newsym(x,y);
	}
	newsym(sx,sy);

	return total;
}